

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O0

int XMLSearch_search_set_tag(XMLSearch *search,SXML_CHAR *tag)

{
  char *pcVar1;
  SXML_CHAR *tag_local;
  XMLSearch *search_local;
  
  if (search == (XMLSearch *)0x0) {
    search_local._4_4_ = 0;
  }
  else if (tag == (SXML_CHAR *)0x0) {
    if (search->tag != (SXML_CHAR *)0x0) {
      free(search->tag);
      search->tag = (SXML_CHAR *)0x0;
    }
    search_local._4_4_ = 1;
  }
  else {
    pcVar1 = strdup(tag);
    search->tag = pcVar1;
    search_local._4_4_ = (uint)(search->tag != (SXML_CHAR *)0x0);
  }
  return search_local._4_4_;
}

Assistant:

int XMLSearch_search_set_tag(XMLSearch* search, const SXML_CHAR* tag)
{
	if (search == NULL)
		return FALSE;

	if (tag == NULL) {
		if (search->tag != NULL) {
			__free(search->tag);
			search->tag = NULL;
		}
		return TRUE;
	}

	search->tag = sx_strdup(tag);
	return (search->tag != NULL);
}